

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::ShaderAtomicExchangeCase::verify
          (ShaderAtomicExchangeCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  ostringstream *poVar1;
  iterator iVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  int in_stack_00000008;
  int outputValue;
  long in_stack_00000010;
  set<int,_std::less<int>,_std::allocator<int>_> usedValues;
  int local_220;
  int local_21c;
  ulong local_218;
  int local_20c;
  int local_208;
  int local_204;
  ShaderAtomicExchangeCase *local_200;
  ulong local_1f8;
  ulong local_1f0;
  size_t local_1e8;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_1e0;
  MessageBuilder local_1b0;
  
  local_204 = (int)tbs;
  uVar5 = (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[1] *
          (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[2] *
          (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[0];
  uVar4 = (long)((ulong)(uint)((int)ctx >> 0x1f) << 0x20 | (ulong)ctx & 0xffffffff) /
          (long)(int)uVar5;
  local_218 = 0;
  uVar7 = 0;
  if (0 < (int)uVar5) {
    uVar7 = (ulong)uVar5;
  }
  local_208 = (int)uVar4;
  local_1f0 = 0;
  if (0 < local_208) {
    local_1f0 = uVar4 & 0xffffffff;
  }
  local_20c = uVar5 * local_204;
  uVar4 = 0;
  local_200 = this;
  local_1e8 = tbslen;
  do {
    if (uVar4 == local_1f0) {
LAB_00451d94:
      return (int)CONCAT71((int7)(int3)((uint)local_208 >> 8),(long)local_208 <= (long)uVar4);
    }
    local_220 = *(int *)(in_stack_00000010 + (int)uVar4 * in_stack_00000008);
    local_1e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1e0._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1e0._M_impl.super__Rb_tree_header._M_header;
    local_1e0._M_impl.super__Rb_tree_header._M_node_count = 0;
    uVar3 = local_218;
    local_1f8 = uVar4;
    local_1e0._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1e0._M_impl.super__Rb_tree_header._M_header._M_left;
    for (uVar6 = 0; uVar4 = local_1f8, uVar7 != uVar6; uVar6 = uVar6 + 1) {
      local_21c = *(int *)(local_1e8 + (long)(int)uVar3);
      if ((local_21c < 0) || ((int)uVar5 < local_21c)) {
LAB_00451cfd:
        local_1b0.m_log =
             ((local_200->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
        poVar1 = &local_1b0.m_str;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
        uVar4 = local_1f8;
        std::operator<<((ostream *)poVar1,"ERROR: at group ");
        std::ostream::operator<<(poVar1,(int)uVar4);
        std::operator<<((ostream *)poVar1,", invocation ");
        std::ostream::operator<<(poVar1,(int)uVar6);
        std::operator<<((ostream *)poVar1,": found unexpected value ");
        std::ostream::operator<<(poVar1,local_21c);
        tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_00451d82;
      }
      iVar2 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
              find(&local_1e0,&local_21c);
      if ((_Rb_tree_header *)iVar2._M_node != &local_1e0._M_impl.super__Rb_tree_header)
      goto LAB_00451cfd;
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &local_1e0,&local_21c);
      uVar3 = (ulong)(uint)((int)uVar3 + local_204);
    }
    if ((local_220 < 0) || ((int)uVar5 < local_220)) {
LAB_00451db1:
      local_1b0.m_log =
           ((local_200->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode.
           m_testCtx)->m_log;
      poVar1 = &local_1b0.m_str;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,"ERROR: at group ");
      std::ostream::operator<<(poVar1,(int)uVar4);
      std::operator<<((ostream *)poVar1,": unexpected final value");
      std::ostream::operator<<(poVar1,local_220);
      tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00451d82:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0.m_str);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&local_1e0);
      goto LAB_00451d94;
    }
    iVar2 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::find
                      (&local_1e0,&local_220);
    if ((_Rb_tree_header *)iVar2._M_node != &local_1e0._M_impl.super__Rb_tree_header)
    goto LAB_00451db1;
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&local_1e0);
    uVar4 = uVar4 + 1;
    local_218 = (ulong)(uint)((int)local_218 + local_20c);
  } while( true );
}

Assistant:

bool verify (int numValues, int inputStride, const void* inputs, int outputStride, const void* outputs, int groupStride, const void* groupOutputs) const
	{
		const int	workGroupSize	= (int)product(m_workGroupSize);
		const int	numWorkGroups	= numValues/workGroupSize;

		DE_UNREF(inputStride && inputs);

		for (int groupNdx = 0; groupNdx < numWorkGroups; groupNdx++)
		{
			const int	groupOffset		= groupNdx*workGroupSize;
			const int	groupOutput		= *(const deInt32*)((const deUint8*)groupOutputs + groupNdx*groupStride);
			set<int>	usedValues;

			for (int localNdx = 0; localNdx < workGroupSize; localNdx++)
			{
				const int outputValue = *(const deInt32*)((const deUint8*)outputs + outputStride*(groupOffset+localNdx));

				if (!de::inRange(outputValue, 0, workGroupSize) || usedValues.find(outputValue) != usedValues.end())
				{
					m_testCtx.getLog() << TestLog::Message << "ERROR: at group " << groupNdx << ", invocation " << localNdx
														   << ": found unexpected value " << outputValue
									   << TestLog::EndMessage;
					return false;
				}
				usedValues.insert(outputValue);
			}

			if (!de::inRange(groupOutput, 0, workGroupSize) || usedValues.find(groupOutput) != usedValues.end())
			{
				m_testCtx.getLog() << TestLog::Message << "ERROR: at group " << groupNdx << ": unexpected final value" << groupOutput << TestLog::EndMessage;
				return false;
			}
		}

		return true;
	}